

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O1

void aom_wb_write_bit(aom_write_bit_buffer *wb,int bit)

{
  byte *pbVar1;
  uint32_t uVar2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  
  uVar2 = wb->bit_offset;
  uVar4 = uVar2 + 7;
  if (-1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  iVar5 = (int)uVar4 >> 3;
  if ((int)uVar2 % 8 == 0) {
    wb->bit_buffer[iVar5] = (char)bit << 7;
  }
  else {
    bVar3 = 7 - (char)((int)uVar2 % 8);
    pbVar1 = wb->bit_buffer + iVar5;
    *pbVar1 = *pbVar1 & ~(byte)(1 << (bVar3 & 0x1f));
    wb->bit_buffer[iVar5] = wb->bit_buffer[iVar5] | (byte)(bit << (bVar3 & 0x1f));
  }
  wb->bit_offset = uVar2 + 1;
  return;
}

Assistant:

void aom_wb_write_bit(struct aom_write_bit_buffer *wb, int bit) {
  const int off = (int)wb->bit_offset;
  const int p = off / CHAR_BIT;
  const int q = CHAR_BIT - 1 - off % CHAR_BIT;
  if (q == CHAR_BIT - 1) {
    // Zero next char and write bit
    wb->bit_buffer[p] = bit << q;
  } else {
    wb->bit_buffer[p] &= ~(1 << q);
    wb->bit_buffer[p] |= bit << q;
  }
  wb->bit_offset = off + 1;
}